

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_envs.cxx
# Opt level: O0

void __thiscall xray_re::xr_sound_env_object::save_v12(xr_sound_env_object *this,xr_ini_writer *w)

{
  xr_ini_writer *pxVar1;
  size_t __n;
  string local_68 [48];
  string local_38 [32];
  xr_ini_writer *local_18;
  xr_ini_writer *w_local;
  xr_sound_env_object *this_local;
  
  local_18 = w;
  w_local = (xr_ini_writer *)this;
  xr_custom_object::save_v12((xr_custom_object *)this,w);
  pxVar1 = local_18;
  std::__cxx11::string::string(local_38,(string *)&this->m_inner);
  xr_ini_writer::write(pxVar1,0x2e3721,local_38,0);
  std::__cxx11::string::~string(local_38);
  pxVar1 = local_18;
  std::__cxx11::string::string(local_68,(string *)&this->m_outer);
  __n = 0;
  xr_ini_writer::write(pxVar1,0x2e372b,local_68,0);
  std::__cxx11::string::~string(local_68);
  xr_ini_writer::write(local_18,0x2e4e39,(void *)0x12,__n);
  return;
}

Assistant:

void xr_sound_env_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("env_inner", m_inner, false);
	w->write("env_outer", m_outer, false);

	w->write("version", SOUNDENV_VERSION);
}